

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

bool DnsStats::IsInSortedList(char **list,size_t nb_list,uint8_t *tld,size_t length)

{
  uint8_t uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t *x;
  size_t sVar9;
  size_t j;
  uint8_t uVar10;
  uint8_t target [64];
  
  if (0x3f < length) {
    return false;
  }
  if (length == 0) {
    pcVar5 = *list;
  }
  else {
    uVar4 = nb_list - 1;
    sVar9 = 0;
    do {
      uVar1 = tld[sVar9];
      uVar10 = uVar1 + 0xe0;
      if (0x19 < (byte)(uVar1 + 0x9f)) {
        uVar10 = uVar1;
      }
      target[sVar9] = uVar10;
      sVar9 = sVar9 + 1;
    } while (length != sVar9);
    pcVar5 = *list;
    sVar9 = 0;
    do {
      bVar2 = pcVar5[sVar9];
      if (bVar2 == 0) {
LAB_0015cc7e:
        sVar9 = 0;
        goto LAB_0015cc85;
      }
      if (bVar2 != target[sVar9]) {
        if (target[sVar9] < bVar2) {
          return false;
        }
        goto LAB_0015cc7e;
      }
      sVar9 = sVar9 + 1;
    } while (length != sVar9);
  }
  return pcVar5[length] == '\0';
LAB_0015cc85:
  bVar2 = list[nb_list - 1][sVar9];
  if (bVar2 == 0) {
    return false;
  }
  if (bVar2 != target[sVar9]) {
    if (bVar2 <= target[sVar9] || uVar4 < 2) {
      return false;
    }
    goto LAB_0015ccc2;
  }
  sVar9 = sVar9 + 1;
  if (length == sVar9) {
    if (list[nb_list - 1][length] == '\0') {
      return true;
    }
    if (1 < uVar4) {
LAB_0015ccc2:
      uVar6 = 0;
      do {
        uVar8 = uVar4 + uVar6 >> 1;
        sVar9 = 0;
        do {
          bVar2 = list[uVar8][sVar9];
          uVar7 = uVar8;
          uVar3 = uVar4;
          if (bVar2 == 0) goto LAB_0015cd06;
          uVar7 = uVar6;
          uVar3 = uVar8;
          if (bVar2 != target[sVar9]) {
            if (bVar2 <= target[sVar9]) {
              uVar7 = uVar8;
              uVar3 = uVar4;
            }
            goto LAB_0015cd06;
          }
          sVar9 = sVar9 + 1;
        } while (length != sVar9);
        if (list[uVar8][length] == '\0') {
          return true;
        }
LAB_0015cd06:
        uVar4 = uVar3;
        uVar6 = uVar7;
      } while (uVar7 + 1 < uVar4);
    }
    return false;
  }
  goto LAB_0015cc85;
}

Assistant:

bool DnsStats::IsInSortedList(const char ** list, size_t nb_list, uint8_t * tld, size_t length)
{
    bool is_found = false;
    size_t i_low = 0;
    size_t i_high = nb_list - 1;
    int c;
    uint8_t target[64];

    if (length < sizeof(target)) {
        for (size_t i = 0; i < length; i++) {
            c = tld[i];
            if (c >= 'a' && c <= 'z') {
                c += 'A' - 'a';
            }
            target[i] = c;
        }

        c = CompareToUpperCaseString(target, length, list[i_low]);
        if (c == 0) {
            is_found = true;
        }
        else if (c < 0) {
            is_found = false;
        }
        else {
            c = CompareToUpperCaseString(target, length, list[i_high]);
            if (c == 0) {
                is_found = true;
            }
            else if (c > 0) {
                is_found = false;
            }
            else {
                while (i_low + 1 < i_high) {
                    size_t i_mid = (i_low + i_high) / 2;
                    c = CompareToUpperCaseString(target, length, list[i_mid]);
                    if (c == 0) {
                        is_found = true;
                        break;
                    }
                    else if (c < 0) {
                        i_high = i_mid;
                    }
                    else {
                        i_low = i_mid;
                    }
                }
            }
        }
    }
    return is_found;
}